

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

InlineeFrameRecord * __thiscall
Js::EntryPointInfo::FindInlineeFrame(EntryPointInfo *this,void *returnAddress)

{
  InProcNativeEntryPointData *this_00;
  InlineeFrameMap *this_01;
  DWORD_PTR DVar1;
  NativeOffsetInlineeFramePair *pNVar2;
  Type *pTVar3;
  InlineeFrameRecord *pIVar4;
  int index;
  int iVar5;
  int index_00;
  
  this_00 = (InProcNativeEntryPointData *)GetNativeEntryPointData(this);
  this_01 = InProcNativeEntryPointData::GetInlineeFrameMap(this_00);
  if (this_01 == (InlineeFrameMap *)0x0) {
LAB_006d7e8a:
    pIVar4 = (InlineeFrameRecord *)0x0;
  }
  else {
    DVar1 = GetNativeAddress(this);
    index_00 = (this_01->
               super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>
               ).count + -1;
    iVar5 = 0;
    do {
      while( true ) {
        if (index_00 < iVar5) goto LAB_006d7e8a;
        index = (index_00 - iVar5) / 2 + iVar5;
        pNVar2 = JsUtil::
                 ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>
                 ::Item(&this_01->
                         super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_DefaultComparer>
                        ,index);
        if ((long)returnAddress - DVar1 <= (ulong)pNVar2->offset) break;
        iVar5 = index + 1;
      }
    } while ((index != 0) &&
            ((index_00 = index + -1, index < 1 ||
             (pTVar3 = JsUtil::
                       List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       ::Item(this_01,index_00),
             (long)returnAddress - DVar1 <= (ulong)pTVar3->offset))));
    pTVar3 = JsUtil::
             List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_01,index);
    pIVar4 = pTVar3->record;
  }
  return pIVar4;
}

Assistant:

InlineeFrameRecord* EntryPointInfo::FindInlineeFrame(void* returnAddress)
    {
#if ENABLE_OOP_NATIVE_CODEGEN
        if (JITManager::GetJITManager()->IsOOPJITEnabled())  // OOP JIT
        {
            OOPNativeEntryPointData * oopNativeEntryPointData = this->GetOOPNativeEntryPointData();
            char * nativeDataBuffer = oopNativeEntryPointData->GetNativeDataBuffer();
            NativeOffsetInlineeFrameRecordOffset* offsets = (NativeOffsetInlineeFrameRecordOffset*)(nativeDataBuffer + oopNativeEntryPointData->GetInlineeFrameOffsetArrayOffset());
            size_t offset = (size_t)((BYTE*)returnAddress - (BYTE*)this->GetNativeAddress());

            uint inlineeFrameOffsetArrayCount = oopNativeEntryPointData->GetInlineeFrameOffsetArrayCount();
            if (inlineeFrameOffsetArrayCount == 0)
            {
                return nullptr;
            }

            uint fromIndex = 0;
            uint toIndex = inlineeFrameOffsetArrayCount - 1;
            while (fromIndex <= toIndex)
            {
                uint midIndex = fromIndex + (toIndex - fromIndex) / 2;
                auto item = offsets[midIndex];

                if (item.offset >= offset)
                {
                    if (midIndex == 0 || (midIndex > 0 && offsets[midIndex - 1].offset < offset))
                    {
                        if (offsets[midIndex].recordOffset == NativeOffsetInlineeFrameRecordOffset::InvalidRecordOffset)
                        {
                            return nullptr;
                        }
                        else
                        {
                            return (InlineeFrameRecord*)(nativeDataBuffer + offsets[midIndex].recordOffset);
                        }
                    }
                    else
                    {
                        toIndex = midIndex - 1;
                    }
                }
                else
                {
                    fromIndex = midIndex + 1;
                }
            }
            return nullptr;
        }
        else
#endif
        // in-proc JIT
        {
            InlineeFrameMap * inlineeFrameMap = this->GetInProcNativeEntryPointData()->GetInlineeFrameMap();
            if (inlineeFrameMap == nullptr)
            {
                return nullptr;
            }

            size_t offset = (size_t)((BYTE*)returnAddress - (BYTE*)this->GetNativeAddress());
            int index = inlineeFrameMap->BinarySearch([=](const NativeOffsetInlineeFramePair& pair, int index) {
                if (pair.offset >= offset)
                {
                    if (index == 0 || (index > 0 && inlineeFrameMap->Item(index - 1).offset < offset))
                    {
                        return 0;
                    }
                    else
                    {
                        return 1;
                    }
                }
                return -1;
            });

            if (index == -1)
            {
                return nullptr;
            }
            return inlineeFrameMap->Item(index).record;
        }

    }